

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

BIO_METHOD * BIO_meth_new(int type,char *name)

{
  BIO_METHOD *method;
  char *name_local;
  BIO_METHOD *pBStack_10;
  int type_local;
  
  pBStack_10 = (BIO_METHOD *)OPENSSL_zalloc(0x50);
  if (pBStack_10 == (BIO_METHOD *)0x0) {
    pBStack_10 = (BIO_METHOD *)0x0;
  }
  else {
    pBStack_10->type = type;
    pBStack_10->name = name;
  }
  return pBStack_10;
}

Assistant:

BIO_METHOD *BIO_meth_new(int type, const char *name) {
  BIO_METHOD *method =
      reinterpret_cast<BIO_METHOD *>(OPENSSL_zalloc(sizeof(BIO_METHOD)));
  if (method == NULL) {
    return NULL;
  }
  method->type = type;
  method->name = name;
  return method;
}